

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_bezier.cpp
# Opt level: O2

int __thiscall ON_BezierCurve::GetNurbForm(ON_BezierCurve *this,ON_NurbsCurve *n)

{
  int iVar1;
  int iVar2;
  bool bVar3;
  uint uVar4;
  double *pdVar5;
  int i;
  double *pdVar6;
  
  bVar3 = ON_NurbsCurve::Create(n,this->m_dim,this->m_is_rat != 0,this->m_order,this->m_order);
  uVar4 = 0;
  if (bVar3) {
    iVar1 = this->m_dim;
    iVar2 = this->m_is_rat;
    for (i = 0; i < this->m_order; i = i + 1) {
      pdVar5 = ON_NurbsCurve::CV(n,i);
      pdVar6 = this->m_cv + (long)i * (long)this->m_cv_stride;
      if (this->m_cv == (double *)0x0) {
        pdVar6 = (double *)0x0;
      }
      memcpy(pdVar5,pdVar6,(long)(int)(((uint)(iVar2 != 0 && 0 < iVar1) + iVar1) * 8));
    }
    pdVar5 = n->m_knot;
    pdVar6 = pdVar5 + (long)this->m_order + -2;
    *(undefined4 *)pdVar6 = 0;
    *(undefined4 *)((long)pdVar6 + 4) = 0;
    *(undefined4 *)(pdVar6 + 1) = 0;
    *(undefined4 *)((long)pdVar6 + 0xc) = 0x3ff00000;
    bVar3 = ON_ClampKnotVector(n->m_order,n->m_cv_count,pdVar5,2);
    uVar4 = (uint)bVar3;
  }
  return uVar4;
}

Assistant:

int ON_BezierCurve::GetNurbForm( ON_NurbsCurve& n ) const
{
  int rc = 0;
  if ( n.Create( m_dim, m_is_rat, m_order, m_order ) ) {
    const int sizeof_cv = CVSize()*sizeof(m_cv[0]);
    int i;
    for ( i = 0; i < m_order; i++ ) {
      memcpy( n.CV(i), CV(i), sizeof_cv );
    }
    n.m_knot[m_order-2] = 0.0;//m_domain.Min();
    n.m_knot[m_order-1] = 1.0;//m_domain.Max();
    rc = ON_ClampKnotVector(n.m_order, n.m_cv_count, n.m_knot, 2) ? 1 : 0;
  }
  return rc;
}